

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void __thiscall tk::_data::_data(_data *this,char *dt,uint32_t sz,bool o)

{
  bool o_local;
  uint32_t sz_local;
  char *dt_local;
  _data *this_local;
  
  if (dt == (char *)0x0) {
    this->size = 0;
    this->owned = false;
    this->data = (char *)0x0;
  }
  else {
    this->size = sz;
    this->owned = o;
    this->data = dt;
  }
  return;
}

Assistant:

_data::_data(char *dt, uint32_t sz, bool o) {
        if(!dt){
            this->size = 0;
            this->owned = false;
            this->data = 0;
        }else{
            this->size = sz;
            this->owned = o;
            this->data = dt;
        }
    }